

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzstrmatrixot.cpp
# Opt level: O3

void __thiscall
TPZStructMatrixOT<std::complex<double>_>::ThreadData::ThreadData
          (ThreadData *this,TPZStructMatrix *strmat,int seqnum,TPZBaseMatrix *rhs,
          set<int,_std::less<int>,_std::allocator<int>_> *MaterialIds,
          TPZAutoPointer<TPZGuiInterface> *guiInterface,atomic<long> *currentIndex)

{
  atomic_int *paVar1;
  TPZReference *pTVar2;
  
  this->fStruct = strmat;
  pTVar2 = guiInterface->fRef;
  (this->fGuiInterface).fRef = pTVar2;
  LOCK();
  paVar1 = &pTVar2->fCounter;
  (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
  UNLOCK();
  this->fGlobMatrix = (TPZBaseMatrix *)0x0;
  this->fGlobRhs = rhs;
  this->fThreadSeqNum = seqnum;
  (this->fMutexAccessElement).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->fMutexAccessElement).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->fMutexAccessElement).super___mutex_base._M_mutex + 0x10) = 0;
  (this->fMutexAccessElement).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->fMutexAccessElement).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  std::condition_variable::condition_variable(&this->fConditionVar);
  this->fCurrentIndex = currentIndex;
  return;
}

Assistant:

TPZStructMatrixOT<TVar>::ThreadData::ThreadData(
    TPZStructMatrix *strmat, int seqnum, TPZBaseMatrix &rhs,
    const std::set<int> &MaterialIds,
    TPZAutoPointer<TPZGuiInterface> guiInterface,
    std::atomic<int64_t> *currentIndex)
: fStruct(strmat),fGuiInterface(guiInterface), fGlobMatrix(0),
  fGlobRhs(&rhs), fThreadSeqNum(seqnum)
{
    this->fCurrentIndex = currentIndex;
    /*	sem_t *sem_open( ... );
     int sem_close(sem_t *sem);
     int sem_unlink(const char *name);
     */
    /*
     #ifdef MACOSX
     std::stringstream sout;
     static int counter = 0;
     sout << "AssemblySem" << counter++;
     fAssembly = sem_open(sout.str().c_str(), O_CREAT,777,1);
     if(fAssembly == SEM_FAILED)
     {
     std::cout << __PRETTY_FUNCTION__ << " could not open the semaphore\n";
     DebugStop();
     }
     #else
     int sem_result = sem_init(&fAssembly,0,0);
     if(sem_result != 0)
     {
     std::cout << __PRETTY_FUNCTION__ << " could not open the semaphore\n";
     }
     #endif
     */
}